

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O0

void Mvc_CoverList2Array(Mvc_Cover_t *pCover)

{
  int iVar1;
  int local_1c;
  Mvc_Cube_t *pMStack_18;
  int Counter;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  Mvc_CoverAllocateArrayCubes(pCover);
  local_1c = 0;
  for (pMStack_18 = (pCover->lCubes).pHead; pMStack_18 != (Mvc_Cube_t *)0x0;
      pMStack_18 = pMStack_18->pNext) {
    pCover->pCubes[local_1c] = pMStack_18;
    local_1c = local_1c + 1;
  }
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if (local_1c == iVar1) {
    return;
  }
  __assert_fail("Counter == Mvc_CoverReadCubeNum(pCover)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcList.c"
                ,0x128,"void Mvc_CoverList2Array(Mvc_Cover_t *)");
}

Assistant:

void Mvc_CoverList2Array( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int Counter;
    // resize storage if necessary
    Mvc_CoverAllocateArrayCubes( pCover );
    // iterate through the cubes
    Counter = 0;
    Mvc_CoverForEachCube( pCover, pCube )
        pCover->pCubes[ Counter++ ] = pCube;
    assert( Counter == Mvc_CoverReadCubeNum(pCover) );
}